

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# badguys.c
# Opt level: O0

void draw_badguys(int r,int g,int b,_func_int_float_ptr_int_ptr_int *project)

{
  int iVar1;
  code *in_RCX;
  int ishape [12];
  float shape [12];
  ALLEGRO_COLOR c;
  BADGUY *bad;
  int *in_stack_00000098;
  int in_stack_000000a4;
  undefined1 in_stack_000000a8 [16];
  undefined1 auStack_98 [4];
  int in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  ALLEGRO_COLOR local_30;
  BADGUY *local_20;
  code *local_18;
  
  local_20 = evildudes;
  local_18 = in_RCX;
  local_30 = makecol(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  for (; local_20 != (BADGUY *)0x0; local_20 = local_20->next) {
    if (0.0 < local_20->y) {
      local_68 = local_20->x - 0.02;
      local_64 = local_20->y + 0.01;
      local_60 = local_20->x;
      local_5c = local_20->y + 0.02;
      local_58 = local_20->x + 0.02;
      local_54 = local_20->y + 0.01;
      local_50 = local_20->x + 0.01;
      local_4c = local_20->y + 0.005;
      local_48 = local_20->x;
      local_44 = local_20->y - 0.015;
      local_40 = local_20->x - 0.01;
      local_3c = local_20->y + 0.005;
      iVar1 = (*local_18)(&local_68,auStack_98,0xc);
      if (iVar1 != 0) {
        polygon(in_stack_000000a4,in_stack_00000098,(ALLEGRO_COLOR)in_stack_000000a8);
      }
    }
  }
  return;
}

Assistant:

void draw_badguys(int r, int g, int b, int (*project)(float *f, int *i, int c))
{
   BADGUY *bad = evildudes;
   ALLEGRO_COLOR c = makecol(r, g, b);
   float shape[12];
   int ishape[12];

   while (bad) {
      if (bad->y > 0) {
	 shape[0] = bad->x - 0.02;
	 shape[1] = bad->y + 0.01;

	 shape[2] = bad->x;
	 shape[3] = bad->y + 0.02;

	 shape[4] = bad->x + 0.02;
	 shape[5] = bad->y + 0.01;

	 shape[6] = bad->x + 0.01;
	 shape[7] = bad->y + 0.005;

	 shape[8] = bad->x;
	 shape[9] = bad->y - 0.015;

	 shape[10] = bad->x - 0.01;
	 shape[11] = bad->y + 0.005;

	 if (project(shape, ishape, 12))
	    polygon(6, ishape, c);
      }

      bad = bad->next;
   }
}